

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O3

uint8_t __thiscall lsim::SimCircuit::read_nibble(SimCircuit *this,uint32_t comp_id)

{
  SimComponent *this_00;
  Simulator *this_01;
  pin_t pin;
  Value VVar1;
  iterator iVar2;
  int i;
  uint32_t index;
  byte bVar3;
  uint32_t local_2c;
  
  local_2c = comp_id;
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_lsim::SimComponent_*>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_components)._M_h,&local_2c);
  if ((iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>.
       _M_cur != (__node_type *)0x0) &&
     (this_00 = *(SimComponent **)
                 ((long)iVar2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>
                        ._M_cur + 0x10), this_00 != (SimComponent *)0x0)) {
    if (this_00->m_output_start == 4) {
      index = 0;
      bVar3 = 0;
      do {
        this_01 = this->m_sim;
        pin = SimComponent::pin_by_index(this_00,index);
        VVar1 = Simulator::read_pin(this_01,pin);
        bVar3 = bVar3 | (byte)(VVar1 << ((byte)index & 0x1f));
        index = index + 1;
      } while (index < this_00->m_output_start);
      return bVar3;
    }
    __assert_fail("comp->num_inputs() == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                  ,0x53,"uint8_t lsim::SimCircuit::read_nibble(uint32_t)");
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0x51,"uint8_t lsim::SimCircuit::read_nibble(uint32_t)");
}

Assistant:

uint8_t SimCircuit::read_nibble(uint32_t comp_id) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    assert(comp->num_inputs() == 4);
    uint8_t result = 0;

    for (int i = 0; i < comp->num_inputs(); ++i) {
        result |= ((int) m_sim->read_pin(comp->pin_by_index(comp->input_pin_index(i)))) << i;
    }

    return result;
}